

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O2

la_ssize_t archive_read_data(archive *_a,void *buff,size_t s)

{
  size_t *s_00;
  long lVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong __n;
  ulong uVar6;
  size_t __n_00;
  void *read_buf;
  int64_t *local_38;
  
  s_00 = &_a->read_data_remaining;
  local_38 = &_a->read_data_offset;
  lVar3 = 0;
  do {
    if (s == 0) {
      _a->read_data_is_posix_read = '\0';
      _a->read_data_requested = 0;
      return lVar3;
    }
    if (*s_00 == 0) {
      read_buf = _a->read_data_block;
      _a->read_data_is_posix_read = '\x01';
      _a->read_data_requested = s;
      iVar2 = archive_read_data_block(_a,&read_buf,s_00,local_38);
      _a->read_data_block = (char *)read_buf;
      if (iVar2 == 1) {
        return lVar3;
      }
      if (iVar2 < 0) {
        return (long)iVar2;
      }
    }
    lVar5 = _a->read_data_offset;
    lVar1 = _a->read_data_output_offset;
    if (lVar5 < lVar1) {
      archive_set_error(_a,0x54,"Encountered out-of-order sparse blocks");
      return -10;
    }
    __n_00 = lVar5 - lVar1;
    if (__n_00 == 0 || lVar5 < lVar1) {
      __n_00 = 0;
    }
    if ((long)(lVar1 + s) < lVar5) {
      __n_00 = s;
    }
    memset(buff,0,__n_00);
    lVar5 = _a->read_data_output_offset + __n_00;
    buff = (void *)((long)buff + __n_00);
    lVar3 = lVar3 + __n_00;
    _a->read_data_output_offset = lVar5;
    uVar6 = s - __n_00;
    s = 0;
    if (uVar6 != 0) {
      uVar4 = *s_00;
      __n = uVar4;
      if (uVar6 <= uVar4) {
        __n = uVar6;
      }
      if (__n != 0) {
        memcpy(buff,_a->read_data_block,__n);
        lVar5 = _a->read_data_output_offset;
        uVar4 = _a->read_data_remaining;
      }
      _a->read_data_block = _a->read_data_block + __n;
      _a->read_data_remaining = uVar4 - __n;
      _a->read_data_output_offset = lVar5 + __n;
      _a->read_data_offset = _a->read_data_offset + __n;
      s = uVar6 - __n;
      buff = (void *)((long)buff + __n);
      lVar3 = lVar3 + __n;
    }
  } while( true );
}

Assistant:

la_ssize_t
archive_read_data(struct archive *_a, void *buff, size_t s)
{
	struct archive *a = (struct archive *)_a;
	char	*dest;
	const void *read_buf;
	size_t	 bytes_read;
	size_t	 len;
	int	 r;

	bytes_read = 0;
	dest = (char *)buff;

	while (s > 0) {
		if (a->read_data_remaining == 0) {
			read_buf = a->read_data_block;
			a->read_data_is_posix_read = 1;
			a->read_data_requested = s;
			r = archive_read_data_block(a, &read_buf,
			    &a->read_data_remaining, &a->read_data_offset);
			a->read_data_block = read_buf;
			if (r == ARCHIVE_EOF)
				return (bytes_read);
			/*
			 * Error codes are all negative, so the status
			 * return here cannot be confused with a valid
			 * byte count.  (ARCHIVE_OK is zero.)
			 */
			if (r < ARCHIVE_OK)
				return (r);
		}

		if (a->read_data_offset < a->read_data_output_offset) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Encountered out-of-order sparse blocks");
			return (ARCHIVE_RETRY);
		}

		/* Compute the amount of zero padding needed. */
		if (a->read_data_output_offset + (int64_t)s <
		    a->read_data_offset) {
			len = s;
		} else if (a->read_data_output_offset <
		    a->read_data_offset) {
			len = (size_t)(a->read_data_offset -
			    a->read_data_output_offset);
		} else
			len = 0;

		/* Add zeroes. */
		memset(dest, 0, len);
		s -= len;
		a->read_data_output_offset += len;
		dest += len;
		bytes_read += len;

		/* Copy data if there is any space left. */
		if (s > 0) {
			len = a->read_data_remaining;
			if (len > s)
				len = s;
			if (len)
				memcpy(dest, a->read_data_block, len);
			s -= len;
			a->read_data_block += len;
			a->read_data_remaining -= len;
			a->read_data_output_offset += len;
			a->read_data_offset += len;
			dest += len;
			bytes_read += len;
		}
	}
	a->read_data_is_posix_read = 0;
	a->read_data_requested = 0;
	return (bytes_read);
}